

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

int_mv av1_get_ref_mv(MACROBLOCK *x,int ref_idx)

{
  int_mv iVar1;
  undefined4 in_ESI;
  long in_RDI;
  int ref_mv_idx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = av1_get_ref_mv_from_stack
                    ((int)in_RDI,(MV_REFERENCE_FRAME *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (int)((ulong)(in_RDI + 0x1a0) >> 0x20),
                     (MB_MODE_INFO_EXT *)**(undefined8 **)(in_RDI + 0x2058));
  return (int_mv)iVar1.as_int;
}

Assistant:

int_mv av1_get_ref_mv(const MACROBLOCK *x, int ref_idx) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  int ref_mv_idx = mbmi->ref_mv_idx;
  if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV) {
    assert(has_second_ref(mbmi));
    ref_mv_idx += 1;
  }
  return av1_get_ref_mv_from_stack(ref_idx, mbmi->ref_frame, ref_mv_idx,
                                   &x->mbmi_ext);
}